

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

int __thiscall Fl_Window_Type::handle(Fl_Window_Type *this,int event)

{
  Fl_Type *pFVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Fl_Type *pFVar5;
  Fl_Menu_Item *pFVar6;
  Fl_Callback_p pFVar7;
  Fl_Window_Type *pFVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  fd_set *__writefds;
  fd_set *__writefds_00;
  fd_set *extraout_RDX;
  fd_set *extraout_RDX_00;
  fd_set *extraout_RDX_01;
  fd_set *extraout_RDX_02;
  fd_set *extraout_RDX_03;
  fd_set *extraout_RDX_04;
  fd_set *extraout_RDX_05;
  fd_set *__writefds_01;
  fd_set *extraout_RDX_06;
  fd_set *__writefds_02;
  undefined4 in_register_00000034;
  char *__file;
  timeval *in_R8;
  bool bVar9;
  Fl_Type *local_f0;
  uint local_dc;
  uint local_cc;
  int local_b0;
  Fl_Menu_Item *m_1;
  Fl_Type *p;
  Fl_Type *i_2;
  Fl_Group *pFStack_78;
  int backtab;
  Fl_Widget *o1_1;
  Fl_Widget_Type *myo_1;
  Fl_Type *i_1;
  int toggle;
  int n;
  int t_2;
  int t_1;
  Fl_Type *t;
  int w1;
  int snap1;
  Fl_Widget *o1;
  Fl_Widget_Type *myo;
  Fl_Type *i;
  Fl_Menu_Item *m;
  int event_local;
  Fl_Window_Type *this_local;
  undefined4 extraout_var;
  
  __file = (char *)CONCAT44(in_register_00000034,event);
  switch(event) {
  case 1:
    iVar4 = Fl::event_x();
    this->mx = iVar4;
    this->x1 = iVar4;
    uVar2 = Fl::event_y();
    pFVar8 = (Fl_Window_Type *)(ulong)uVar2;
    this->my = uVar2;
    this->y1 = uVar2;
    this->dy = 0;
    this->dx = 0;
    this->drag = 0;
    iVar4 = Fl::event_button();
    if (iVar4 < 3) {
      myo = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
      handle::selection = (Fl_Type *)this;
      while( true ) {
        bVar9 = false;
        if (myo != (Fl_Widget_Type *)0x0) {
          bVar9 = (this->super_Fl_Widget_Type).super_Fl_Type.level < (myo->super_Fl_Type).level;
          pFVar8 = this;
        }
        if (!bVar9) break;
        iVar4 = (*(myo->super_Fl_Type)._vptr_Fl_Type[0x17])();
        if ((iVar4 != 0) && (iVar4 = (*(myo->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar4 == 0)) {
          for (_w1 = (Fl_Group *)myo->o; _w1 != (Fl_Group *)0x0;
              _w1 = Fl_Widget::parent(&_w1->super_Fl_Widget)) {
            uVar2 = Fl_Widget::visible(&_w1->super_Fl_Widget);
            if (uVar2 == 0) goto LAB_001a734b;
          }
          iVar4 = Fl::event_inside(myo->o);
          if (iVar4 != 0) {
            handle::selection = &myo->super_Fl_Type;
            iVar4 = Fl::event_clicks();
            if (iVar4 == 1) {
              reveal_in_browser(&myo->super_Fl_Type);
            }
          }
        }
LAB_001a734b:
        myo = (Fl_Widget_Type *)(myo->super_Fl_Type).next;
      }
      if (((((this->numselected != 0) && (iVar4 = Fl::event_state(0x10000), iVar4 == 0)) &&
           (uVar2 = this->br + snap, pFVar8 = (Fl_Window_Type *)(ulong)uVar2, this->mx <= (int)uVar2
           )) && ((uVar2 = this->bx - snap, pFVar8 = (Fl_Window_Type *)(ulong)uVar2,
                  (int)uVar2 <= this->mx &&
                  (uVar2 = this->bt + snap, pFVar8 = (Fl_Window_Type *)(ulong)uVar2,
                  this->my <= (int)uVar2)))) &&
         (uVar2 = this->by - snap, pFVar8 = (Fl_Window_Type *)(ulong)uVar2, (int)uVar2 <= this->my))
      {
        if (snap < 6) {
          local_b0 = 5;
        }
        else {
          local_b0 = snap;
        }
        t._0_4_ = (this->br - this->bx) / 4;
        if (local_b0 < (int)t) {
          t._0_4_ = local_b0;
        }
        if (this->mx < this->br - (int)t) {
          if (this->mx < this->bx + (int)t) {
            this->drag = this->drag | 1;
          }
        }
        else {
          this->drag = this->drag | 2;
        }
        t._0_4_ = (this->bt - this->by) / 4;
        if (local_b0 < (int)t) {
          t._0_4_ = local_b0;
        }
        if (this->by + (int)t < this->my) {
          uVar2 = this->bt - (int)t;
          if ((int)uVar2 < this->my) {
            uVar2 = this->drag | 4;
            this->drag = uVar2;
          }
        }
        else {
          uVar2 = this->drag | 8;
          this->drag = uVar2;
        }
        pFVar8 = (Fl_Window_Type *)(ulong)uVar2;
        if (this->drag == 0) {
          this->drag = 0x10;
        }
      }
      iVar4 = (*handle::selection->_vptr_Fl_Type[7])
                        (handle::selection,(ulong)(uint)this->mx,(ulong)(uint)this->my);
      pFVar5 = (Fl_Type *)CONCAT44(extraout_var,iVar4);
      if (pFVar5 == (Fl_Type *)0x0) {
        if (this->drag == 0) {
          this->drag = 0x20;
        }
      }
      else {
        iVar3 = Fl::event_state(0x10000);
        if (iVar3 == 0) {
          deselect();
          select(iVar4,(fd_set *)&DAT_00000001,__writefds_00,(fd_set *)pFVar8,in_R8);
          iVar4 = (*pFVar5->_vptr_Fl_Type[0x1e])();
          if (iVar4 != 0) {
            (*pFVar5->_vptr_Fl_Type[0xb])();
          }
        }
        else {
          Fl::event_is_click(0);
          select(iVar4,(fd_set *)(ulong)((pFVar5->selected != '\0' ^ 0xffU) & 1),__writefds,
                 (fd_set *)pFVar8,in_R8);
        }
        handle::selection = pFVar5;
        this->drag = 0;
      }
      this_local._4_4_ = 1;
    }
    else {
      in_this_only = (Fl_Type *)this;
      pFVar6 = Fl_Menu_Item::popup(New_Menu,this->mx,this->my,"New",handle::myprev,(Fl_Menu_ *)0x0);
      if ((pFVar6 != (Fl_Menu_Item *)0x0) &&
         (pFVar7 = Fl_Menu_Item::callback(pFVar6), pFVar7 != (Fl_Callback_p)0x0)) {
        handle::myprev = pFVar6;
        Fl_Menu_Item::do_callback(pFVar6,(this->super_Fl_Widget_Type).o);
      }
      in_this_only = (Fl_Type *)0x0;
      this_local._4_4_ = 1;
    }
    break;
  case 2:
    if (this->drag == 0) {
      this_local._4_4_ = 0;
    }
    else {
      iVar4 = Fl::event_x();
      this->mx = iVar4;
      iVar4 = Fl::event_y();
      this->my = iVar4;
      if ((this->drag == 0x20) ||
         (((this->dx == 0 && (this->dy == 0)) && (iVar4 = Fl::event_is_click(), iVar4 != 0)))) {
        iVar3 = Fl::event_clicks();
        iVar4 = extraout_EDX;
        if ((iVar3 == 0) && (iVar3 = Fl::event_state(0x40000), iVar4 = extraout_EDX_00, iVar3 == 0))
        {
          if (this->mx < this->x1) {
            iVar4 = this->x1;
            this->x1 = this->mx;
            this->mx = iVar4;
          }
          pFVar8 = this;
          if (this->my < this->y1) {
            uVar2 = this->y1;
            this->y1 = this->my;
            pFVar8 = (Fl_Window_Type *)(ulong)uVar2;
            this->my = uVar2;
          }
          i_1._4_4_ = 0;
          iVar4 = Fl::event_state(0x10000);
          if (iVar4 == 0) {
            deselect();
            __writefds_01 = extraout_RDX;
          }
          else {
            Fl::event_is_click(0);
            __writefds_01 = extraout_RDX_00;
          }
          myo_1 = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
          while( true ) {
            bVar9 = false;
            if (myo_1 != (Fl_Widget_Type *)0x0) {
              bVar9 = (this->super_Fl_Widget_Type).super_Fl_Type.level <
                      (myo_1->super_Fl_Type).level;
              pFVar8 = this;
            }
            if (!bVar9) break;
            iVar3 = (*(myo_1->super_Fl_Type)._vptr_Fl_Type[0x17])();
            __writefds_01 = extraout_RDX_01;
            if ((iVar3 != 0) &&
               (iVar3 = (*(myo_1->super_Fl_Type)._vptr_Fl_Type[0x1e])(),
               __writefds_01 = extraout_RDX_02, iVar3 == 0)) {
              for (pFStack_78 = (Fl_Group *)myo_1->o; pFStack_78 != (Fl_Group *)0x0;
                  pFStack_78 = Fl_Widget::parent(&pFStack_78->super_Fl_Widget)) {
                uVar2 = Fl_Widget::visible(&pFStack_78->super_Fl_Widget);
                __writefds_01 = extraout_RDX_03;
                if (uVar2 == 0) goto LAB_001a7a20;
              }
              iVar3 = Fl::event_inside(myo_1->o);
              if (iVar3 != 0) {
                handle::selection = &myo_1->super_Fl_Type;
              }
              iVar3 = Fl_Widget::x(myo_1->o);
              pFVar8 = this;
              __writefds_01 = extraout_RDX_04;
              if ((this->x1 <= iVar3) &&
                 (iVar3 = Fl_Widget::y(myo_1->o), __writefds_01 = extraout_RDX_05, this->y1 < iVar3)
                 ) {
                iVar3 = Fl_Widget::x(myo_1->o);
                uVar2 = Fl_Widget::w(myo_1->o);
                __writefds_01 = (fd_set *)(ulong)uVar2;
                if ((int)(iVar3 + uVar2) < this->mx) {
                  iVar3 = Fl_Widget::y(myo_1->o);
                  uVar2 = Fl_Widget::h(myo_1->o);
                  __writefds_01 = (fd_set *)(ulong)uVar2;
                  if ((int)(iVar3 + uVar2) < this->my) {
                    i_1._4_4_ = i_1._4_4_ + 1;
                    if (iVar4 == 0) {
                      local_cc = 1;
                    }
                    else {
                      local_cc = (uint)(((myo_1->super_Fl_Type).selected != '\0' ^ 0xffU) & 1);
                    }
                    select((int)myo_1,(fd_set *)(ulong)local_cc,__writefds_01,(fd_set *)this,in_R8);
                    __writefds_01 = extraout_RDX_06;
                  }
                }
              }
            }
LAB_001a7a20:
            myo_1 = (Fl_Widget_Type *)(myo_1->super_Fl_Type).next;
          }
          if (i_1._4_4_ == 0) {
            if (iVar4 == 0) {
              local_dc = 1;
            }
            else {
              local_dc = (uint)((handle::selection->selected != '\0' ^ 0xffU) & 1);
            }
            select((int)handle::selection,(fd_set *)(ulong)local_dc,__writefds_01,(fd_set *)pFVar8,
                   in_R8);
          }
        }
        else {
          Fl_Widget_Type::open(&this->super_Fl_Widget_Type,__file,iVar4);
        }
      }
      else if ((this->dx != 0) || (this->dy != 0)) {
        moveallchildren(this);
      }
      this->drag = 0;
      Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)(this->super_Fl_Widget_Type).o);
      this_local._4_4_ = 1;
    }
    break;
  default:
    this_local._4_4_ = 0;
    break;
  case 5:
    if (this->drag == 0) {
      this_local._4_4_ = 0;
    }
    else {
      iVar4 = Fl::event_x();
      this->mx = iVar4;
      iVar4 = Fl::event_y();
      this->my = iVar4;
      newdx(this);
      this_local._4_4_ = 1;
    }
    break;
  case 8:
    uVar2 = Fl::event_key();
    pFVar8 = (Fl_Window_Type *)(ulong)uVar2;
    if (uVar2 != 0x6f) {
      if (uVar2 != 0xff09) {
        if (uVar2 == 0xff1b) {
          (*((this->super_Fl_Widget_Type).o)->_vptr_Fl_Widget[6])();
          return 1;
        }
        if (uVar2 == 0xff51) {
          this->dx = -1;
          this->dy = 0;
        }
        else if (uVar2 == 0xff52) {
          this->dx = 0;
          this->dy = -1;
        }
        else if (uVar2 == 0xff53) {
          this->dx = 1;
          this->dy = 0;
        }
        else {
          if (uVar2 != 0xff54) {
            return 0;
          }
          this->dx = 0;
          this->dy = 1;
        }
        iVar4 = Fl::event_state(0x10000);
        iVar3 = 0x10;
        if (iVar4 != 0) {
          iVar3 = 10;
        }
        this->drag = iVar3;
        iVar4 = Fl::event_state(0x40000);
        if (iVar4 != 0) {
          this->dx = gridx * this->dx;
          this->dy = gridy * this->dy;
        }
        moveallchildren(this);
        this->drag = 0;
        return 1;
      }
      iVar4 = Fl::event_state(0x10000);
      p = Fl_Type::current;
      while( true ) {
        bVar9 = false;
        if (p != (Fl_Type *)0x0) {
          uVar2 = (*p->_vptr_Fl_Type[0x17])();
          pFVar8 = (Fl_Window_Type *)(ulong)uVar2;
          bVar9 = true;
          if (uVar2 != 0) {
            iVar3 = (*p->_vptr_Fl_Type[0x1e])();
            bVar9 = iVar3 != 0;
          }
        }
        if (!bVar9) break;
        p = p->parent;
      }
      if (p != (Fl_Type *)0x0) {
        for (m_1 = (Fl_Menu_Item *)p->parent;
            m_1 != (Fl_Menu_Item *)0x0 && (Fl_Window_Type *)m_1 != this;
            m_1 = (Fl_Menu_Item *)m_1[1].text) {
        }
        if (((m_1 == (Fl_Menu_Item *)0x0) ||
            (iVar3 = (**(code **)(m_1->text + 0xb8))(), pFVar5 = p, iVar3 == 0)) &&
           ((p = (this->super_Fl_Widget_Type).super_Fl_Type.next, p == (Fl_Type *)0x0 ||
            (pFVar8 = this, pFVar5 = p, p->level <= (this->super_Fl_Widget_Type).super_Fl_Type.level
            )))) {
          return 0;
        }
        do {
          if (iVar4 == 0) {
            local_f0 = p->next;
          }
          else {
            local_f0 = p->prev;
          }
          p = local_f0;
          pFVar1 = pFVar5;
        } while (((local_f0 != (Fl_Type *)0x0) &&
                 (pFVar8 = this, (this->super_Fl_Widget_Type).super_Fl_Type.level < local_f0->level)
                 ) && ((iVar3 = (*local_f0->_vptr_Fl_Type[0x17])(), iVar3 == 0 ||
                       (iVar3 = (*local_f0->_vptr_Fl_Type[0x1e])(), pFVar1 = p, iVar3 != 0))));
        p = pFVar1;
        deselect();
        select((int)p,(fd_set *)&DAT_00000001,__writefds_02,(fd_set *)pFVar8,in_R8);
        return 1;
      }
      return 0;
    }
    toggle_overlays((Fl_Widget *)0x0,(void *)0x0);
  case 0xc:
    in_this_only = (Fl_Type *)this;
    pFVar6 = Fl_Menu_Item::test_shortcut(Main_Menu);
    if ((pFVar6 != (Fl_Menu_Item *)0x0) &&
       (pFVar7 = Fl_Menu_Item::callback(pFVar6), pFVar7 != (Fl_Callback_p)0x0)) {
      Fl_Menu_Item::do_callback(pFVar6,(this->super_Fl_Widget_Type).o);
    }
    in_this_only = (Fl_Type *)0x0;
    this_local._4_4_ = (uint)(pFVar6 != (Fl_Menu_Item *)0x0);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Window_Type::handle(int event) {
  static Fl_Type* selection;
  switch (event) {
  case FL_PUSH:
    x1 = mx = Fl::event_x();
    y1 = my = Fl::event_y();
    drag = dx = dy = 0;
    // test for popup menu:
    if (Fl::event_button() >= 3) {
      in_this_only = this; // modifies how some menu items work.
      static const Fl_Menu_Item* myprev;
      const Fl_Menu_Item* m = New_Menu->popup(mx,my,"New",myprev);
      if (m && m->callback()) {myprev = m; m->do_callback(this->o);}
      in_this_only = 0;
      return 1;
    }
    // find the innermost item clicked on:
    selection = this;
    {for (Fl_Type* i=next; i && i->level>level; i=i->next)
      if (i->is_widget() && !i->is_menu_item()) {
      Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
      for (Fl_Widget *o1 = myo->o; o1; o1 = o1->parent())
	if (!o1->visible()) goto CONTINUE2;
      if (Fl::event_inside(myo->o)) {
        selection = myo;
        if (Fl::event_clicks()==1)
          reveal_in_browser(myo);
      }
    CONTINUE2:;
    }}
    // see if user grabs edges of selected region:
    if (numselected && !(Fl::event_state(FL_SHIFT)) &&
	mx<=br+snap && mx>=bx-snap && my<=bt+snap && my>=by-snap) {
      int snap1 = snap>5 ? snap : 5;
      int w1 = (br-bx)/4; if (w1 > snap1) w1 = snap1;
      if (mx>=br-w1) drag |= RIGHT;
      else if (mx<bx+w1) drag |= LEFT;
      w1 = (bt-by)/4; if (w1 > snap1) w1 = snap1;
      if (my<=by+w1) drag |= TOP;
      else if (my>bt-w1) drag |= BOTTOM;
      if (!drag) drag = DRAG;
    }
    // do object-specific selection of other objects:
    {Fl_Type* t = selection->click_test(mx, my);
    if (t) {
      //if (t == selection) return 1; // indicates mouse eaten w/o change
      if (Fl::event_state(FL_SHIFT)) {
	Fl::event_is_click(0);
	select(t, !t->selected);
      } else {
	deselect();
	select(t, 1);
	if (t->is_menu_item()) t->open();
      }
      selection = t;
      drag = 0;
    } else {
      if (!drag) drag = BOX; // if all else fails, start a new selection region
    }}
    return 1;

  case FL_DRAG:
    if (!drag) return 0;
    mx = Fl::event_x();
    my = Fl::event_y();
    newdx();
    return 1;

  case FL_RELEASE:
    if (!drag) return 0;
    mx = Fl::event_x();
    my = Fl::event_y();
    if (drag != BOX && (dx || dy || !Fl::event_is_click())) {
      if (dx || dy) moveallchildren();
    } else if ((Fl::event_clicks() || Fl::event_state(FL_CTRL))) {
      Fl_Widget_Type::open();
    } else {
      if (mx<x1) {int t = x1; x1 = mx; mx = t;}
      if (my<y1) {int t = y1; y1 = my; my = t;}
      int n = 0;
      int toggle = Fl::event_state(FL_SHIFT);
      // clear selection on everything:
      if (!toggle) deselect(); else Fl::event_is_click(0);
      // select everything in box:
      for (Fl_Type*i=next; i&&i->level>level; i=i->next)
	if (i->is_widget() && !i->is_menu_item()) {
	Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
	for (Fl_Widget *o1 = myo->o; o1; o1 = o1->parent())
	  if (!o1->visible()) goto CONTINUE;
	if (Fl::event_inside(myo->o)) selection = myo;
	if (myo->o->x()>=x1 && myo->o->y()>y1 &&
	    myo->o->x()+myo->o->w()<mx && myo->o->y()+myo->o->h()<my) {
	  n++;
	  select(myo, toggle ? !myo->selected : 1);
	}
      CONTINUE:;
      }
      // if nothing in box, select what was clicked on:
      if (!n) {
	select(selection, toggle ? !selection->selected : 1);
      }
    }
    drag = 0;
    ((Overlay_Window *)o)->redraw_overlay();
    return 1;

  case FL_KEYBOARD: {

    int backtab = 0;
    switch (Fl::event_key()) {

    case FL_Escape:
      ((Fl_Window*)o)->hide();
      return 1;

    case FL_Tab: {
      if (Fl::event_state(FL_SHIFT)) backtab = 1;
      // find current child:
      Fl_Type *i = Fl_Type::current;
      while (i && (!i->is_widget() || i->is_menu_item())) i = i->parent;
      if (!i) return 0;
      Fl_Type *p = i->parent;
      while (p && p != this) p = p->parent;
      if (!p || !p->is_widget()) {
	i = next; if (!i || i->level <= level) return 0;
      }
      p = i;
      for (;;) {
	i = backtab ? i->prev : i->next;
	if (!i || i->level <= level) {i = p; break;}
	if (i->is_widget() && !i->is_menu_item()) break;
      }
      deselect(); select(i,1);
      return 1;}

    case FL_Left:  dx = -1; dy = 0; goto ARROW;
    case FL_Right: dx = +1; dy = 0; goto ARROW;
    case FL_Up:    dx = 0; dy = -1; goto ARROW;
    case FL_Down:  dx = 0; dy = +1; goto ARROW;
    ARROW:
      // for some reason BOTTOM/TOP are swapped... should be fixed...
      drag = (Fl::event_state(FL_SHIFT)) ? (RIGHT|TOP) : DRAG;
      if (Fl::event_state(FL_CTRL)) {dx *= gridx; dy *= gridy;}
      moveallchildren();
      drag = 0;
      return 1;

    case 'o':
      toggle_overlays(0, 0);
      break;

    default:
      return 0;
    }}

  case FL_SHORTCUT: {
    in_this_only = this; // modifies how some menu items work.
    const Fl_Menu_Item* m = Main_Menu->test_shortcut();
    if (m && m->callback()) m->do_callback(this->o);
    in_this_only = 0;
    return (m != 0);}

  default:
    return 0;
  }
}